

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O2

void output_vec<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *vec,ostream *stream)

{
  ostream *poVar1;
  float *pfVar2;
  
  for (pfVar2 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pfVar2 != (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish; pfVar2 = pfVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)stream,*pfVar2);
    std::operator<<(poVar1," ");
  }
  std::operator<<(stream,"\n");
  return;
}

Assistant:

void output_vec(T vec, std::ostream & stream=std::clog) 
{
  for (auto it = vec.begin(); it != vec.end(); ++it)
  {
    stream << *it << " ";
  }
  stream << "\n";
  return;
}